

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O3

void __thiscall
flatbuffers::kotlin::KotlinGenerator::GenerateCreateVectorField
          (KotlinGenerator *this,FieldDef *field,CodeWriter *writer,IDLOptions *options)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Type type;
  long *plVar2;
  size_t sVar3;
  mapped_type *pmVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  size_type *psVar6;
  Type *type_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params;
  string method_name;
  _Alloc_hider _Var7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  _Any_data local_d8;
  code *local_c8;
  code *local_c0;
  allocator<char> local_b1;
  string local_b0;
  undefined1 local_90 [32];
  string local_70;
  string local_50;
  
  local_90._0_4_ = (field->value).type.element;
  local_90._24_2_ = (field->value).type.fixed_length;
  local_90._4_4_ = BASE_TYPE_NONE;
  local_90._8_4_ = *(undefined4 *)&(field->value).type.struct_def;
  local_90._12_4_ = *(undefined4 *)((long)&(field->value).type.struct_def + 4);
  local_90._16_4_ = *(undefined4 *)&(field->value).type.enum_def;
  local_90._20_4_ = *(undefined4 *)((long)&(field->value).type.enum_def + 4);
  paVar1 = &local_b0.field_2;
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"create","");
  _Var7._M_p = (pointer)&local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xffffffffffffff08,"vector","");
  (*(this->namer_).super_Namer._vptr_Namer[2])
            (&local_50,&this->namer_,&local_b0,field,&stack0xffffffffffffff08);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var7._M_p != &local_e8) {
    operator_delete(_Var7._M_p,local_e8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_d8._M_pod_data,
             *(char **)(GenTypeBasic[abi:cxx11](flatbuffers::BaseType_const&)::kotlin_typename +
                       (ulong)(uint)local_90._0_4_ * 8),&local_b1);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,0x368036);
  paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 == paVar5) {
    local_e8._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_e8._8_8_ = plVar2[3];
    _Var7._M_p = (pointer)&local_e8;
  }
  else {
    local_e8._M_allocated_capacity = paVar5->_M_allocated_capacity;
    _Var7._M_p = (pointer)*plVar2;
  }
  *plVar2 = (long)paVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append(&stack0xffffffffffffff08);
  psVar6 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_b0.field_2._M_allocated_capacity = *psVar6;
    local_b0.field_2._8_8_ = plVar2[3];
    local_b0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar6;
    local_b0._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_b0._M_string_length = plVar2[1];
  *plVar2 = (long)psVar6;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var7._M_p != &local_e8) {
    operator_delete(_Var7._M_p,local_e8._M_allocated_capacity + 1);
  }
  if ((code **)local_d8._M_unused._0_8_ != &local_c8) {
    operator_delete(local_d8._M_unused._M_object,(ulong)(local_c8 + 1));
  }
  _Var7._M_p = (pointer)&local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xffffffffffffff08,"size","");
  sVar3 = InlineSize((Type *)local_90);
  NumToString<unsigned_long>((string *)&local_d8,sVar3);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&writer->value_map_,(key_type *)&stack0xffffffffffffff08);
  std::__cxx11::string::_M_assign((string *)pmVar4);
  if ((code **)local_d8._M_unused._0_8_ != &local_c8) {
    operator_delete(local_d8._M_unused._M_object,(ulong)(local_c8 + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var7._M_p != &local_e8) {
    operator_delete(_Var7._M_p,local_e8._M_allocated_capacity + 1);
  }
  _Var7._M_p = (pointer)&local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xffffffffffffff08,"align","");
  sVar3 = InlineAlignment((Type *)local_90);
  NumToString<unsigned_long>((string *)&local_d8,sVar3);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&writer->value_map_,(key_type *)&stack0xffffffffffffff08);
  std::__cxx11::string::_M_assign((string *)pmVar4);
  if ((code **)local_d8._M_unused._0_8_ != &local_c8) {
    operator_delete(local_d8._M_unused._M_object,(ulong)(local_c8 + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var7._M_p != &local_e8) {
    operator_delete(_Var7._M_p,local_e8._M_allocated_capacity + 1);
  }
  _Var7._M_p = (pointer)&local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xffffffffffffff08,"root","");
  GenMethod_abi_cxx11_((string *)&local_d8,(KotlinGenerator *)local_90,type_00);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&writer->value_map_,(key_type *)&stack0xffffffffffffff08);
  std::__cxx11::string::_M_assign((string *)pmVar4);
  if ((code **)local_d8._M_unused._0_8_ != &local_c8) {
    operator_delete(local_d8._M_unused._M_object,(ulong)(local_c8 + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var7._M_p != &local_e8) {
    operator_delete(_Var7._M_p,local_e8._M_allocated_capacity + 1);
  }
  _Var7._M_p = (pointer)&local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xffffffffffffff08,"cast","");
  type.element = local_90._12_4_;
  type.base_type = local_90._8_4_;
  type.struct_def._4_4_ = local_90._20_4_;
  type.struct_def._0_4_ = local_90._16_4_;
  type.enum_def._2_6_ = local_90._26_6_;
  type.enum_def._0_2_ = local_90._24_2_;
  type._24_8_ = _Var7._M_p;
  CastToSigned_abi_cxx11_(type);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&writer->value_map_,(key_type *)&stack0xffffffffffffff08);
  std::__cxx11::string::_M_assign((string *)pmVar4);
  if ((code **)local_d8._M_unused._0_8_ != &local_c8) {
    operator_delete(local_d8._M_unused._M_object,(ulong)(local_c8 + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var7._M_p != &local_e8) {
    operator_delete(_Var7._M_p,local_e8._M_allocated_capacity + 1);
  }
  if (((uint)local_90._0_4_ < BASE_TYPE_FLOAT) &&
     ((0x552U >> (local_90._0_4_ & (BASE_TYPE_UNION|BASE_TYPE_STRUCT)) & 1) != 0)) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"@kotlin.ExperimentalUnsignedTypes","");
    CodeWriter::operator+=(writer,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  _Var7._M_p = (pointer)&local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xffffffffffffff08,"Int","");
  local_d8._8_8_ = 0;
  local_c0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_kotlin.cpp:709:9)>
             ::_M_invoke;
  local_c8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_kotlin.cpp:709:9)>
             ::_M_manager;
  local_d8._M_unused._M_object = writer;
  GenerateFun(writer,&local_50,&local_b0,(string *)&stack0xffffffffffffff08,
              (function<void_()> *)&local_d8,options->gen_jvmstatic);
  if (local_c8 != (code *)0x0) {
    (*local_c8)(&local_d8,&local_d8,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var7._M_p != &local_e8) {
    operator_delete(_Var7._M_p,local_e8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void GenerateCreateVectorField(FieldDef &field, CodeWriter &writer,
                                 const IDLOptions options) const {
    auto vector_type = field.value.type.VectorType();
    auto method_name = namer_.Method("create", field, "vector");
    auto params = "builder: FlatBufferBuilder, data: " +
                  GenTypeBasic(vector_type.base_type) + "Array";
    writer.SetValue("size", NumToString(InlineSize(vector_type)));
    writer.SetValue("align", NumToString(InlineAlignment(vector_type)));
    writer.SetValue("root", GenMethod(vector_type));
    writer.SetValue("cast", CastToSigned(vector_type));

    if (IsUnsigned(vector_type.base_type)) {
      writer += "@kotlin.ExperimentalUnsignedTypes";
    }
    GenerateFun(
        writer, method_name, params, "Int",
        [&]() {
          writer += "builder.startVector({{size}}, data.size, {{align}})";
          writer += "for (i in data.size - 1 downTo 0) {";
          writer.IncrementIdentLevel();
          writer += "builder.add{{root}}(data[i]{{cast}})";
          writer.DecrementIdentLevel();
          writer += "}";
          writer += "return builder.endVector()";
        },
        options.gen_jvmstatic);
  }